

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RepeatGreedyLoopNoBacktrackInst::Exec
          (RepeatGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  char *pcVar1;
  int iVar2;
  Program *pPVar3;
  LoopInfo *pLVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  
  uVar10 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar10 + 9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar6) goto LAB_00f0e72c;
    *puVar7 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar10] != 'P') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar6) goto LAB_00f0e72c;
    *puVar7 = 0;
  }
  pPVar3 = (matcher->program).ptr;
  iVar2 = *(int *)((pPVar3->rep).insts.insts.ptr + uVar10 + 1);
  lVar11 = (long)iVar2;
  if ((lVar11 < 0) || (pPVar3->numLoops <= iVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                       "loopId >= 0 && loopId < program->numLoops");
    if (!bVar6) goto LAB_00f0e72c;
    *puVar7 = 0;
  }
  pLVar4 = (matcher->loopInfos).ptr;
  pLVar4[lVar11].number = pLVar4[lVar11].number + 1;
  if (*inputOffset == pLVar4[lVar11].startInputOffset) {
    bVar6 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
    return bVar6;
  }
  pcVar8 = ContinuousPageStack<1UL>::Top
                     ((ContinuousPageStack<1UL> *)contStack,
                      (contStack->
                      super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                      topElementSize);
  pcVar1 = pcVar8 + 8;
  if (pcVar8 == (char *)0x0) {
    pcVar1 = (char *)0x0;
LAB_00f0e639:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xe9c,"(top != 0 && top->tag == Cont::ContTag::Resume)",
                       "top != 0 && top->tag == Cont::ContTag::Resume");
    if (!bVar6) goto LAB_00f0e72c;
    *puVar7 = 0;
  }
  else if (pcVar8[0x10] != '\0') goto LAB_00f0e639;
  *(CharCount *)(pcVar1 + 0xc) = *inputOffset;
  pLVar4[lVar11].startInputOffset = *inputOffset;
  uVar9 = (this->super_RepeatLoopMixin).beginLabel + 9;
  if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar9) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x76d,"(label < program->rep.insts.instsLen)",
                       "label < program->rep.insts.instsLen");
    if (!bVar6) {
LAB_00f0e72c:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar7 = 0;
  }
  *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar9;
  return false;
}

Assistant:

inline bool RepeatGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginGreedyLoopNoBacktrackInst* begin = matcher.L2I(BeginGreedyLoopNoBacktrack, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (inputOffset == loopInfo->startInputOffset)
        {
            // No progress
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack, continue from here with no more iterations.
            // Since the loop body is deterministic and group free, it wouldn't have left any continuation records.
            // Therefore we can simply update the Resume continuation still on the top of the stack with the current
            // input pointer.
            Cont* top = contStack.Top();
            Assert(top != 0 && top->tag == Cont::ContTag::Resume);
            ResumeCont* resume = (ResumeCont*)top;
            resume->origInputOffset = inputOffset;

            loopInfo->startInputOffset = inputOffset;
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginGreedyLoopNoBacktrackInst));
        }
        return false;
    }